

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  string *psVar1;
  string local_1f8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [376];
  App *local_20;
  App *sub_local;
  Formatter *this_local;
  
  local_20 = sub;
  sub_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  psVar1 = App::get_name_abi_cxx11_(local_20);
  ::std::__cxx11::string::string((string *)&local_1c8,(string *)psVar1);
  App::get_description_abi_cxx11_(&local_1f8,local_20);
  detail::format_help(local_198,&local_1c8,&local_1f8,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out, sub->get_name(), sub->get_description(), column_width_);
    return out.str();
}